

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

string * __thiscall pbrt::PowerLightSampler::ToString_abi_cxx11_(PowerLightSampler *this)

{
  string *in_RDI;
  AliasTable *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::AliasTable_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string PowerLightSampler::ToString() const {
    return StringPrintf("[ PowerLightSampler aliasTable: %s ]", aliasTable);
}